

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

int lyb_parse_value(lys_type *type,lyd_node_leaf_list *leaf,lyd_attr *attr,char *data,
                   unres_data *unres,lyb_state *lybs)

{
  LY_DATA_TYPE LVar1;
  lys_node_leaf *plVar2;
  int iVar3;
  uint uVar4;
  lyd_val lVar5;
  lys_module *plVar6;
  lys_type *plVar7;
  lyd_val *plVar8;
  size_t sVar9;
  lys_ident *plVar10;
  byte bVar11;
  LY_DATA_TYPE *pLVar12;
  lyd_val *plVar13;
  byte bVar14;
  LY_DATA_TYPE LVar15;
  UNRES_ITEM type_00;
  char *pcVar16;
  uint8_t *puVar17;
  char *__format;
  long lVar18;
  ly_ctx *ctx;
  ulong uVar19;
  undefined8 uVar20;
  lyd_node_leaf_list *leaf_00;
  lyd_attr *attr_00;
  size_t bytes;
  int iVar21;
  ulong uVar22;
  size_t sStack_c0;
  ulong local_b8;
  long local_b0;
  uint local_a4;
  unres_data *local_a0;
  char *local_98;
  char *str;
  int local_7c;
  lyd_val *local_78;
  lyd_val *local_70;
  lyd_attr *local_68;
  lyd_node_leaf_list *local_60;
  byte local_51;
  lyd_val *plStack_50;
  uint8_t start_byte;
  ly_ctx *local_48;
  byte local_39;
  lys_type *plStack_38;
  uint8_t byte;
  
  if ((leaf != (lyd_node_leaf_list *)0x0) != (attr == (lyd_attr *)0x0)) {
    __assert_fail("(leaf || attr) && (!leaf || !attr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                  ,0x2b5,
                  "int lyb_parse_value(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, const char *, struct unres_data *, struct lyb_state *)"
                 );
  }
  if (leaf == (lyd_node_leaf_list *)0x0) {
    local_78 = (lyd_val *)&attr->value_str;
    local_70 = &attr->value;
    plStack_50 = (lyd_val *)&attr->value_type;
    local_48 = (ly_ctx *)&attr->value_flags;
  }
  else {
    local_78 = (lyd_val *)&leaf->value_str;
    local_70 = &leaf->value;
    plStack_50 = (lyd_val *)&leaf->value_type;
    local_48 = (ly_ctx *)&leaf->value_flags;
  }
  bytes = 1;
  local_a0 = unres;
  local_68 = attr;
  plStack_38 = type;
  local_a4 = lyb_read(data,&local_51,1,lybs);
  if ((int)local_a4 < 0) {
    return -1;
  }
  plStack_50->uint32 = local_51 & 0x1f;
  if ((char)local_51 < '\0') {
    if (leaf == (lyd_node_leaf_list *)0x0) {
      __assert_fail("leaf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                    ,0x2ca,
                    "int lyb_parse_value(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, const char *, struct unres_data *, struct lyb_state *)"
                   );
    }
    leaf->field_0x9 = leaf->field_0x9 | 1;
  }
  bVar14 = local_51 >> 5 & 2;
  bVar11 = *(byte *)&(local_48->dict).hash_tab;
  if ((local_51 & 0x60) != 0) {
    *(byte *)&(local_48->dict).hash_tab = local_51 >> 5 & 1 | bVar14 | bVar11;
  }
  pcVar16 = data + local_a4;
  iVar3 = plStack_50->int32;
  local_98 = (char *)0x0;
  local_60 = leaf;
  if (bVar14 != 0 || (bVar11 & 2) != 0) {
    iVar3 = lyb_read_string(pcVar16,&local_98,0,lybs);
    if (iVar3 < 0) {
      return -1;
    }
    pcVar16 = lydict_insert_zc(lybs->ctx,local_98);
    local_78->binary = pcVar16;
    goto LAB_00141992;
  }
  plVar7 = plStack_38;
  if (iVar3 == 6) {
    for (; plVar7->base == LY_TYPE_LEAFREF; plVar7 = &((plVar7->info).lref.target)->type) {
    }
    for (; (plVar7->info).bits.count == 0; plVar7 = &plVar7->der->type) {
    }
  }
  else if (iVar3 == 2) {
    for (; plVar7->base == LY_TYPE_LEAFREF; plVar7 = &((plVar7->info).lref.target)->type) {
    }
    for (; (plVar7->info).bits.count == 0; plVar7 = &plVar7->der->type) {
    }
  }
  switch(iVar3) {
  case 1:
  case 10:
  case 0x14:
    iVar3 = lyb_read_string(pcVar16,&local_98,0,lybs);
    if (iVar3 < 0) {
      return -1;
    }
    pcVar16 = lydict_insert_zc(lybs->ctx,local_98);
    plVar8 = local_70;
    goto LAB_0014186f;
  case 2:
    lVar5.ptr = calloc((ulong)(plVar7->info).bits.count,8);
    *local_70 = lVar5;
    if (lVar5.binary == (char *)0x0) {
      pcVar16 = "lyb_parse_val_1";
      ctx = lybs->ctx;
LAB_00141f7f:
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar16);
      return -1;
    }
    lVar18 = 0;
    iVar3 = 0;
    for (uVar22 = 0; uVar22 < (plVar7->info).bits.count; uVar22 = uVar22 + 1) {
      if ((uVar22 & 7) == 0) {
        local_b0 = lVar18;
        local_7c = iVar3;
        iVar3 = lyb_read(pcVar16 + iVar3,&local_39,1,lybs);
        if (iVar3 < 0) {
          return -1;
        }
        iVar3 = local_7c + iVar3;
        lVar5.dec64._1_7_ = 0;
        lVar5.bln = local_39;
        lVar18 = local_b0;
      }
      if (((lVar5.uint32 & 0xff) >> (int)(uVar22 & 7) & 1) != 0) {
        *(long *)(local_70->binary + uVar22 * 8) = (long)&((plVar7->info).bits.bit)->name + lVar18;
      }
      lVar18 = lVar18 + 0x30;
    }
    goto LAB_001418a2;
  case 3:
    iVar3 = lyb_read(pcVar16,&local_39,1,lybs);
    if ((iVar3 < 1) || (local_39 == 0)) goto LAB_001418a2;
    local_70->bln = 1;
    break;
  case 4:
  case 0x12:
  case 0x13:
    sStack_c0 = 8;
    goto LAB_00141881;
  case 5:
    iVar3 = 0;
    break;
  case 6:
    uVar4 = (plVar7->info).bits.count;
    if (0xff < uVar4) {
      if (uVar4 < 0x10000) {
        bytes = 2;
      }
      else {
        bytes = 4 - (ulong)(uVar4 < 0x1000000);
      }
    }
    local_b8 = 0;
    iVar3 = lyb_read_number(&local_b8,8,bytes,pcVar16,lybs);
    if (iVar3 < 1) goto LAB_001418a2;
    if ((plVar7->info).bits.count <= local_b8) {
      __assert_fail("num < type->info.enums.count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                    ,0x1c3,
                    "int lyb_parse_val_1(struct lys_type *, LY_DATA_TYPE, uint8_t, const char *, const char **, lyd_val *, struct lyb_state *)"
                   );
    }
    local_70->binary = (char *)((plVar7->info).bits.bit + local_b8);
    break;
  case 7:
  case 8:
  case 0xb:
    iVar3 = lyb_read_string(pcVar16,&local_98,0,lybs);
    if (iVar3 < 0) {
      return -1;
    }
    pcVar16 = lydict_insert_zc(lybs->ctx,local_98);
    plVar8 = local_78;
LAB_0014186f:
    plVar8->binary = pcVar16;
    break;
  default:
    return -1;
  case 0xc:
  case 0xd:
    sStack_c0 = 1;
    goto LAB_00141881;
  case 0xe:
  case 0xf:
    sStack_c0 = 2;
    goto LAB_00141881;
  case 0x10:
  case 0x11:
    sStack_c0 = 4;
LAB_00141881:
    iVar3 = lyb_read_number(local_70,sStack_c0,sStack_c0,pcVar16,lybs);
LAB_001418a2:
    if (iVar3 < 0) {
      return -1;
    }
  }
LAB_00141992:
  leaf_00 = local_60;
  attr_00 = local_68;
  iVar21 = -1;
  if ((plStack_38->base == LY_TYPE_UNION) && (((ulong)(local_48->dict).hash_tab & 2) == 0)) {
    if (plStack_50->int32 != 10) {
      __assert_fail("*value_type == LY_TYPE_STRING",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                    ,0x2d9,
                    "int lyb_parse_value(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, const char *, struct unres_data *, struct lyb_state *)"
                   );
    }
    local_78->binary = *(char **)local_70;
    local_70->binary = (char *)0x0;
    plStack_50->int32 = 0xb;
  }
  local_7c = iVar3;
  if (local_60 == (lyd_node_leaf_list *)0x0) {
    plVar6 = local_68->annotation->module;
    local_48 = plVar6->ctx;
    plVar6 = lys_main_module(plVar6);
    plVar8 = &attr_00->value;
    plVar13 = (lyd_val *)&attr_00->value_str;
    puVar17 = &attr_00->value_flags;
    pLVar12 = &attr_00->value_type;
  }
  else {
    local_48 = local_60->schema->module->ctx;
    plVar6 = lys_node_module(local_60->schema);
    plVar8 = &leaf_00->value;
    plVar13 = (lyd_val *)&leaf_00->value_str;
    puVar17 = &leaf_00->value_flags;
    pLVar12 = &leaf_00->value_type;
  }
  if ((*puVar17 & 2) != 0) {
    *puVar17 = *puVar17 & 0xfd;
    if (leaf_00 == (lyd_node_leaf_list *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (byte)leaf_00->field_0x9 & 1;
    }
    plVar7 = lyp_parse_value(plStack_38,&plVar13->binary,(lyxml_elem *)0x0,leaf_00,attr_00,
                             (lys_module *)0x0,1,uVar4,1);
    if (plVar7 == (lys_type *)0x0) {
      return -1;
    }
    if ((*puVar17 & 2) == 0) {
      ly_log(local_48,LY_LLWRN,LY_SUCCESS,
             "Value \"%s\" was stored as a user type, but it is not in the current context.",plVar13
            );
    }
    goto LAB_00141e42;
  }
  LVar1 = *pLVar12;
  LVar15 = plStack_38->base;
  if ((1 < LVar15 - LY_TYPE_INST) &&
     ((LVar15 != LY_TYPE_UNION || ((plStack_38->info).uni.has_ptr_type == 0)))) {
    if (LVar1 == LY_TYPE_DEC64) goto switchD_00141a66_caseD_4;
    if (LVar1 == LY_TYPE_BITS) goto switchD_00141a66_caseD_2;
    plVar7 = (lys_type *)0x0;
    goto switchD_00141a66_caseD_3;
  }
  plVar7 = (lys_type *)0x0;
  switch(LVar1) {
  case LY_TYPE_BITS:
switchD_00141a66_caseD_2:
    plVar7 = plStack_38;
    while (LVar15 == LY_TYPE_LEAFREF) {
      plVar2 = (plVar7->info).lref.target;
      plVar7 = &plVar2->type;
      LVar15 = (plVar2->type).base;
    }
    for (; (plVar7->info).bits.count == 0; plVar7 = &plVar7->der->type) {
    }
    break;
  case LY_TYPE_DEC64:
switchD_00141a66_caseD_4:
    plVar7 = plStack_38;
    while (LVar15 == LY_TYPE_LEAFREF) {
      plVar2 = (plStack_38->info).lref.target;
      plVar7 = &plVar2->type;
      LVar15 = (plVar2->type).base;
    }
    break;
  case LY_TYPE_IDENT:
  case LY_TYPE_INST:
  case LY_TYPE_UNION:
    goto switchD_00141a66_caseD_7;
  }
switchD_00141a66_caseD_3:
  plStack_50 = plVar13;
  switch(LVar1) {
  case LY_TYPE_BINARY:
  case LY_TYPE_STRING:
  case LY_TYPE_UNKNOWN:
    lVar5.ident = *(lys_ident **)plVar8;
    goto LAB_00141d95;
  case LY_TYPE_BITS:
    local_78 = plVar8;
    plVar8 = (lyd_val *)malloc(1);
    if (plVar8 == (lyd_val *)0x0) {
      ly_log(local_48,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyb_parse_val_2");
      return -1;
    }
    plVar8->bln = 0;
    uVar19 = 0;
    plVar13 = local_78;
    for (uVar22 = 0; uVar22 < (plVar7->info).bits.count; uVar22 = uVar22 + 1) {
      if (*(undefined8 **)(plVar13->binary + uVar22 * 8) != (undefined8 *)0x0) {
        iVar3 = (int)uVar19;
        sVar9 = strlen((char *)**(undefined8 **)(plVar13->binary + uVar22 * 8));
        plVar8 = (lyd_val *)ly_realloc(plVar8,(uVar19 - (iVar3 == 0)) + sVar9 + 2);
        plVar13 = local_78;
        if (plVar8 == (lyd_val *)0x0) {
          pcVar16 = "lyb_parse_val_2";
          ctx = local_48;
          goto LAB_00141f7f;
        }
        pcVar16 = "";
        if (iVar3 != 0) {
          pcVar16 = " ";
        }
        local_70 = plVar8;
        iVar21 = sprintf((char *)(uVar19 + (long)plVar8),"%s%s",pcVar16,
                         **(undefined8 **)(local_78->binary + uVar22 * 8));
        uVar19 = (ulong)(uint)(iVar3 + iVar21);
        plVar8 = local_70;
        attr_00 = local_68;
      }
    }
    pcVar16 = lydict_insert_zc(local_48,&plVar8->bln);
    plStack_50->binary = pcVar16;
    leaf_00 = local_60;
    break;
  case LY_TYPE_BOOL:
    pcVar16 = "true";
    if (plVar8->bln == 0) {
      pcVar16 = "false";
    }
    goto LAB_00141d8a;
  case LY_TYPE_DEC64:
    uVar22 = (plVar7->info).dec64.div;
    bVar11 = (plVar7->info).dec64.dig;
    uVar19 = (ulong)plVar8->dec64 % uVar22;
    while( true ) {
      if ((bVar11 < 2) || ((long)uVar19 % 10 != 0)) break;
      bVar11 = bVar11 - 1;
      uVar19 = (long)uVar19 / 10;
    }
    sprintf((char *)&local_98,"%ld.%.*ld",(long)plVar8->dec64 / (long)uVar22);
    goto LAB_00141d83;
  case LY_TYPE_EMPTY:
    pcVar16 = "";
    goto LAB_00141d8a;
  case LY_TYPE_ENUM:
    pcVar16 = plVar8->enm->name;
    goto LAB_00141d8a;
  case LY_TYPE_IDENT:
    if (leaf_00 == (lyd_node_leaf_list *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (byte)leaf_00->field_0x9 & 1;
    }
    plVar10 = resolve_identref(plStack_38,plVar13->binary,(lyd_node *)leaf_00,plVar6,uVar4);
    plVar8->ident = plVar10;
    if (plVar10 == (lys_ident *)0x0) {
      return -1;
    }
    break;
  case LY_TYPE_INST:
    plVar8->binary = (char *)0x0;
    break;
  default:
    goto switchD_00141b45_caseD_9;
  case LY_TYPE_UNION:
    if (attr_00 != (lyd_attr *)0x0) {
      uVar20 = 0x250;
      goto LAB_00141dee;
    }
    iVar3 = resolve_union(leaf_00,plStack_38,1,2,(lys_type **)0x0);
    if (iVar3 != 0) {
      return -1;
    }
    break;
  case LY_TYPE_INT8:
    uVar22 = (ulong)(uint)(int)plVar8->bln;
    goto LAB_00141d1a;
  case LY_TYPE_UINT8:
    uVar22 = (ulong)plVar8->uint8;
    goto LAB_00141d6b;
  case LY_TYPE_INT16:
    uVar22 = (ulong)(uint)(int)plVar8->int16;
    goto LAB_00141d1a;
  case LY_TYPE_UINT16:
    uVar22 = (ulong)plVar8->uint16;
    goto LAB_00141d6b;
  case LY_TYPE_INT32:
    uVar22 = (ulong)plVar8->uint32;
LAB_00141d1a:
    pcVar16 = "%d";
LAB_00141d72:
    sprintf((char *)&local_98,pcVar16,uVar22);
LAB_00141d83:
    pcVar16 = (char *)&local_98;
LAB_00141d8a:
    lVar5.binary = lydict_insert(local_48,pcVar16,0);
LAB_00141d95:
    plStack_50->ident = (lys_ident *)lVar5;
    break;
  case LY_TYPE_UINT32:
    uVar22 = (ulong)plVar8->uint32;
LAB_00141d6b:
    pcVar16 = "%u";
    goto LAB_00141d72;
  case LY_TYPE_INT64:
    pcVar16 = plVar8->binary;
    __format = "%ld";
    goto LAB_00141d55;
  case LY_TYPE_UINT64:
    pcVar16 = plVar8->binary;
    __format = "%lu";
LAB_00141d55:
    sprintf((char *)&local_98,__format,pcVar16);
    goto LAB_00141d83;
  }
  LVar15 = plStack_38->base;
  plVar13 = plStack_50;
  if (LVar15 - LY_TYPE_INST < 2) {
switchD_00141a66_caseD_7:
    if (plVar13->binary == (char *)0x0) {
      __assert_fail("*value_str",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                    ,0x28f,
                    "int lyb_parse_val_2(struct lys_type *, struct lyd_node_leaf_list *, struct lyd_attr *, struct unres_data *)"
                   );
    }
    if (attr_00 != (lyd_attr *)0x0) {
      uVar20 = 0x293;
LAB_00141dee:
      ly_log(local_48,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
             ,uVar20);
      return -1;
    }
    if (LVar15 == LY_TYPE_LEAFREF) {
      type_00 = UNRES_LEAFREF;
    }
    else if (LVar15 == LY_TYPE_INST) {
      type_00 = UNRES_INSTID;
    }
    else {
      type_00 = UNRES_UNION;
    }
    iVar3 = unres_data_add(local_a0,(lyd_node *)leaf_00,type_00);
    if (iVar3 != 0) {
      return -1;
    }
  }
  else if ((LVar15 == LY_TYPE_UNION) && ((plStack_38->info).uni.has_ptr_type != 0)) {
    LVar15 = LY_TYPE_UNION;
    goto switchD_00141a66_caseD_7;
  }
LAB_00141e42:
  iVar21 = local_7c + local_a4;
switchD_00141b45_caseD_9:
  return iVar21;
}

Assistant:

static int
lyb_parse_value(struct lys_type *type, struct lyd_node_leaf_list *leaf, struct lyd_attr *attr, const char *data,
                struct unres_data *unres, struct lyb_state *lybs)
{
    int r, ret = 0;
    uint8_t start_byte;

    const char **value_str;
    lyd_val *value;
    LY_DATA_TYPE *value_type;
    uint8_t *value_flags;

    assert((leaf || attr) && (!leaf || !attr));

    if (leaf) {
        value_str = &leaf->value_str;
        value = &leaf->value;
        value_type = &leaf->value_type;
        value_flags = &leaf->value_flags;
    } else {
        value_str = &attr->value_str;
        value = &attr->value;
        value_type = &attr->value_type;
        value_flags = &attr->value_flags;
    }

    /* read value type and flags on the first byte */
    ret += (r = lyb_read(data, &start_byte, sizeof start_byte, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    /* fill value type, flags */
    *value_type = start_byte & 0x1F;
    if (start_byte & 0x80) {
        assert(leaf);
        leaf->dflt = 1;
    }
    if (start_byte & 0x40) {
        *value_flags |= LY_VALUE_USER;
    }
    if (start_byte & 0x20) {
        *value_flags |= LY_VALUE_UNRES;
    }

    ret += (r = lyb_parse_val_1(type, *value_type, *value_flags, data, value_str, value, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    /* union is handled specially */
    if ((type->base == LY_TYPE_UNION) && !(*value_flags & LY_VALUE_USER)) {
        assert(*value_type == LY_TYPE_STRING);

        *value_str = value->string;
        value->string = NULL;
        *value_type = LY_TYPE_UNION;
    }

    ret += (r = lyb_parse_val_2(type, leaf, attr, unres));
    LYB_HAVE_READ_RETURN(r, data, -1);

    return ret;
}